

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O2

int __thiscall CVmDynFuncVMIfc::validate_obj(CVmDynFuncVMIfc *this,tctarg_obj_id_t obj)

{
  int iVar1;
  
  iVar1 = CVmObjTable::is_obj_id_valid(&G_obj_table_X,obj);
  return iVar1;
}

Assistant:

virtual int validate_obj(tctarg_obj_id_t obj)
    {
        VMGLOB_PTR(vmg);
        return G_obj_table->is_obj_id_valid(obj);
    }